

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O0

void __thiscall
duckdb::TaskScheduler::ScheduleTask
          (TaskScheduler *this,ProducerToken *token,shared_ptr<duckdb::Task,_true> *task)

{
  pointer this_00;
  shared_ptr<duckdb::Task,_true> *in_RDX;
  shared_ptr<duckdb::Task,_true> *in_stack_00000030;
  ProducerToken *in_stack_00000038;
  unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
  *in_stack_ffffffffffffffb0;
  
  this_00 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
            ::operator->(in_stack_ffffffffffffffb0);
  shared_ptr<duckdb::Task,_true>::shared_ptr((shared_ptr<duckdb::Task,_true> *)this_00,in_RDX);
  ConcurrentQueue::Enqueue((ConcurrentQueue *)task,in_stack_00000038,in_stack_00000030);
  shared_ptr<duckdb::Task,_true>::~shared_ptr((shared_ptr<duckdb::Task,_true> *)0x994887);
  return;
}

Assistant:

void TaskScheduler::ScheduleTask(ProducerToken &token, shared_ptr<Task> task) {
	// Enqueue a task for the given producer token and signal any sleeping threads
	queue->Enqueue(token, std::move(task));
}